

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool array_container_is_subset_run(array_container_t *container1,run_container_t *container2)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  
  lVar5 = cpuid_Extended_Feature_Enumeration_info(7);
  iVar3 = container1->cardinality;
  if ((*(uint *)(lVar5 + 4) & 0x20) == 0) {
    iVar6 = container2->n_runs;
    lVar5 = (long)iVar6;
    if (0 < lVar5) {
      lVar7 = 0;
      do {
        iVar6 = iVar6 + (uint)container2->runs[lVar7].length;
        lVar7 = lVar7 + 1;
      } while (lVar5 != lVar7);
    }
  }
  else {
    iVar6 = _avx2_run_container_cardinality(container2);
  }
  uVar4 = 0;
  if (iVar3 <= iVar6) {
    iVar6 = 0;
    for (; (iVar6 < iVar3 && ((int)uVar4 < container2->n_runs)); uVar4 = uVar4 + (uVar8 < uVar2)) {
      uVar1 = container2->runs[(int)uVar4].value;
      uVar2 = container1->array[iVar6];
      if (uVar2 < uVar1) {
        uVar4 = 0;
        goto LAB_0010ec7f;
      }
      uVar8 = (uint)container2->runs[(int)uVar4].length + (uint)uVar1;
      iVar6 = (iVar6 + 1) - (uint)(uVar8 < uVar2);
    }
    uVar4 = (uint)(iVar6 == iVar3);
  }
LAB_0010ec7f:
  return SUB41(uVar4,0);
}

Assistant:

bool array_container_is_subset_run(const array_container_t* container1,
                                   const run_container_t* container2) {
    if (container1->cardinality > run_container_cardinality(container2))
        return false;
    int i_array = 0, i_run = 0;
    while (i_array < container1->cardinality && i_run < container2->n_runs) {
        uint32_t start = container2->runs[i_run].value;
        uint32_t stop = start + container2->runs[i_run].length;
        if (container1->array[i_array] < start) {
            return false;
        } else if (container1->array[i_array] > stop) {
            i_run++;
        } else {  // the value of the array is in the run
            i_array++;
        }
    }
    if (i_array == container1->cardinality) {
        return true;
    } else {
        return false;
    }
}